

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsLib.cpp
# Opt level: O0

long __thiscall bhf::ads::SendRecv(ads *this,string *remote,Frame *f,uint32_t serviceId)

{
  Frame *pFVar1;
  pointer host;
  size_t sVar2;
  ostream *poVar3;
  void *pvVar4;
  undefined4 in_register_0000000c;
  size_t __n;
  void *__buf;
  string local_7e0 [32];
  stringstream local_7c0 [8];
  stringstream stream_3;
  ostream local_7b0 [380];
  uint local_634;
  string local_630 [4];
  uint service;
  stringstream local_610 [8];
  stringstream stream_2;
  ostream local_600 [380];
  uint local_484;
  string local_480 [4];
  uint invoke;
  stringstream local_460 [8];
  stringstream stream_1;
  ostream local_450 [376];
  uint local_2d8;
  undefined4 local_2d4;
  uint cookie;
  stringstream local_2b0 [8];
  stringstream stream;
  ostream local_2a0 [376];
  undefined8 uStack_128;
  timeval timeout;
  undefined1 local_110 [8];
  UdpSocket s;
  allocator local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  AddressList addresses;
  uint local_28;
  uint local_24;
  Frame *pFStack_20;
  uint32_t serviceId_local;
  Frame *f_local;
  string *remote_local;
  
  __n = CONCAT44(in_register_0000000c,serviceId);
  local_24 = (uint)f;
  pFStack_20 = (Frame *)remote;
  f_local = (Frame *)this;
  local_28 = htole<unsigned_int>(local_24);
  Frame::prepend<unsigned_int>((Frame *)remote,&local_28);
  pFVar1 = pFStack_20;
  addresses._M_t.super___uniq_ptr_impl<addrinfo,_void_(*)(addrinfo_*)>._M_t.
  super__Tuple_impl<0UL,_addrinfo_*,_void_(*)(addrinfo_*)>.super__Head_base<0UL,_addrinfo_*,_false>.
  _M_head_impl._4_4_ = htole<unsigned_int>(0);
  Frame::prepend<unsigned_int>
            (pFVar1,(uint *)((long)&addresses._M_t.
                                    super___uniq_ptr_impl<addrinfo,_void_(*)(addrinfo_*)>._M_t.
                                    super__Tuple_impl<0UL,_addrinfo_*,_void_(*)(addrinfo_*)>.
                                    super__Head_base<0UL,_addrinfo_*,_false>._M_head_impl + 4));
  pFVar1 = pFStack_20;
  addresses._M_t.super___uniq_ptr_impl<addrinfo,_void_(*)(addrinfo_*)>._M_t.
  super__Tuple_impl<0UL,_addrinfo_*,_void_(*)(addrinfo_*)>.super__Head_base<0UL,_addrinfo_*,_false>.
  _M_head_impl._0_4_ = htole<unsigned_int>(0x71146603);
  Frame::prepend<unsigned_int>
            (pFVar1,(uint *)&addresses._M_t.super___uniq_ptr_impl<addrinfo,_void_(*)(addrinfo_*)>.
                             _M_t.super__Tuple_impl<0UL,_addrinfo_*,_void_(*)(addrinfo_*)>.
                             super__Head_base<0UL,_addrinfo_*,_false>);
  pFVar1 = f_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"48899",&local_61);
  GetListOfAddresses((ads *)local_40,(string *)pFVar1,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  host = std::unique_ptr<addrinfo,_void_(*)(addrinfo_*)>::get
                   ((unique_ptr<addrinfo,_void_(*)(addrinfo_*)> *)local_40);
  UdpSocket::UdpSocket((UdpSocket *)local_110,host);
  Socket::write((Socket *)local_110,(int)pFStack_20,__buf,__n);
  Frame::reset(pFStack_20,0x1000);
  uStack_128 = 5;
  timeout.tv_sec = 0;
  Socket::read((Socket *)local_110,(int)pFStack_20,&uStack_128,__n);
  sVar2 = Frame::capacity(pFStack_20);
  if (sVar2 < 0xc) {
    std::__cxx11::stringstream::stringstream(local_2b0);
    poVar3 = std::operator<<(local_2a0,"SendRecv");
    poVar3 = std::operator<<(poVar3,"(): frame too short to be AMS response \'0x");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    sVar2 = Frame::capacity(pFStack_20);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,sVar2);
    std::operator<<(poVar3,"\'\n");
    std::__cxx11::stringstream::str();
    Logger::Log(3,(string *)&cookie);
    std::__cxx11::string::~string((string *)&cookie);
    std::__cxx11::stringstream::~stringstream(local_2b0);
    remote_local = (string *)0x705;
  }
  else {
    local_2d8 = Frame::pop_letoh<unsigned_int>(pFStack_20);
    if (local_2d8 == 0x71146603) {
      local_484 = Frame::pop_letoh<unsigned_int>(pFStack_20);
      if (local_484 == 0) {
        local_634 = Frame::pop_letoh<unsigned_int>(pFStack_20);
        if ((local_24 | 0x80000000) == local_634) {
          remote_local = (string *)0x0;
        }
        else {
          std::__cxx11::stringstream::stringstream(local_7c0);
          poVar3 = std::operator<<(local_7b0,"SendRecv");
          poVar3 = std::operator<<(poVar3,"(): response contains invalid serviceId \'");
          pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
          poVar3 = (ostream *)std::ostream::operator<<(pvVar4,local_634);
          std::operator<<(poVar3,"\'\n");
          std::__cxx11::stringstream::str();
          Logger::Log(3,local_7e0);
          std::__cxx11::string::~string((string *)local_7e0);
          std::__cxx11::stringstream::~stringstream(local_7c0);
          remote_local = (string *)0x706;
        }
      }
      else {
        std::__cxx11::stringstream::stringstream(local_610);
        poVar3 = std::operator<<(local_600,"SendRecv");
        poVar3 = std::operator<<(poVar3,"(): response contains invalid invokeId \'");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_484);
        std::operator<<(poVar3,"\'\n");
        std::__cxx11::stringstream::str();
        Logger::Log(3,local_630);
        std::__cxx11::string::~string((string *)local_630);
        std::__cxx11::stringstream::~stringstream(local_610);
        remote_local = (string *)0x706;
      }
    }
    else {
      std::__cxx11::stringstream::stringstream(local_460);
      poVar3 = std::operator<<(local_450,"SendRecv");
      poVar3 = std::operator<<(poVar3,"(): response contains invalid cookie \'");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2d8);
      std::operator<<(poVar3,"\'\n");
      std::__cxx11::stringstream::str();
      Logger::Log(3,local_480);
      std::__cxx11::string::~string((string *)local_480);
      std::__cxx11::stringstream::~stringstream(local_460);
      remote_local = (string *)0x706;
    }
  }
  local_2d4 = 1;
  UdpSocket::~UdpSocket((UdpSocket *)local_110);
  std::unique_ptr<addrinfo,_void_(*)(addrinfo_*)>::~unique_ptr
            ((unique_ptr<addrinfo,_void_(*)(addrinfo_*)> *)local_40);
  return (long)remote_local;
}

Assistant:

static long SendRecv(const std::string& remote, Frame& f, const uint32_t serviceId)
{
    f.prepend(htole(serviceId));

    static const uint32_t invokeId = 0;
    f.prepend(htole(invokeId));

    static const uint32_t UDP_COOKIE = 0x71146603;
    f.prepend(htole(UDP_COOKIE));

    const auto addresses = GetListOfAddresses(remote, "48899");
    UdpSocket s{addresses.get()};
    s.write(f);
    f.reset();

    static constexpr auto headerLength = sizeof(serviceId) + sizeof(invokeId) + sizeof(UDP_COOKIE);
    timeval timeout { 5, 0 };
    s.read(f, &timeout);
    if (headerLength > f.capacity()) {
        LOG_ERROR(__FUNCTION__ << "(): frame too short to be AMS response '0x" << std::hex << f.capacity() << "'\n");
        return ADSERR_DEVICE_INVALIDSIZE;
    }

    const auto cookie = f.pop_letoh<uint32_t>();
    if (UDP_COOKIE != cookie) {
        LOG_ERROR(__FUNCTION__ << "(): response contains invalid cookie '" << cookie << "'\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }
    const auto invoke = f.pop_letoh<uint32_t>();
    if (invokeId != invoke) {
        LOG_ERROR(__FUNCTION__ << "(): response contains invalid invokeId '" << invoke << "'\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }
    const auto service = f.pop_letoh<uint32_t>();
    if ((UdpServiceId::RESPONSE | serviceId) != service) {
        LOG_ERROR(__FUNCTION__ << "(): response contains invalid serviceId '" << std::hex << service << "'\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }
    return 0;
}